

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O0

void __thiscall
TPZFrontMatrix<float,_TPZStackEqnStorage<float>,_TPZFrontSym<float>_>::SymbolicAddKel
          (TPZFrontMatrix<float,_TPZStackEqnStorage<float>,_TPZFrontSym<float>_> *this,
          TPZVec<long> *destinationindex)

{
  TPZFrontMatrix<float,_TPZStackEqnStorage<float>,_TPZFrontSym<float>_> *in_RSI;
  TPZVec<long> *in_RDI;
  TPZFrontSym<float> *unaff_retaddr;
  int64_t maxeq;
  int64_t mineq;
  long in_stack_ffffffffffffffe0;
  long in_stack_ffffffffffffffe8;
  
  TPZFrontSym<float>::SymbolicAddKel(unaff_retaddr,in_RDI);
  EquationsToDecompose
            ((TPZFrontMatrix<float,_TPZStackEqnStorage<float>,_TPZFrontSym<float>_> *)mineq,
             (TPZVec<long> *)maxeq,(int64_t *)unaff_retaddr,(int64_t *)in_RDI);
  if (in_stack_ffffffffffffffe8 <= in_stack_ffffffffffffffe0) {
    TPZFrontSym<float>::SymbolicDecomposeEquations
              ((TPZFrontSym<float> *)in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    CheckCompress(in_RSI);
  }
  return;
}

Assistant:

void TPZFrontMatrix<TVar,store, front>::SymbolicAddKel(TPZVec < int64_t > & destinationindex)
{
	fFront.SymbolicAddKel(destinationindex);
	int64_t mineq, maxeq;
	EquationsToDecompose(destinationindex, mineq, maxeq);
	
	if(maxeq >= mineq) {
		fFront.SymbolicDecomposeEquations(mineq,maxeq);
		CheckCompress();
	}
	
}